

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O2

void ly_load_plugins(void)

{
  char *pcVar1;
  DIR *pDVar2;
  int *piVar3;
  char *pcVar4;
  
  pthread_mutex_lock((pthread_mutex_t *)&plugins_lock);
  plugin_refs = plugin_refs + 1;
  pcVar1 = getenv("LIBYANG_EXTENSIONS_PLUGINS_DIR");
  pcVar4 = "/usr/local/lib/libyang/extensions";
  if (pcVar1 != (char *)0x0) {
    pcVar4 = pcVar1;
  }
  pDVar2 = opendir(pcVar4);
  if (pDVar2 == (DIR *)0x0) {
    piVar3 = __errno_location();
    pcVar1 = strerror(*piVar3);
    ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
           "Failed to open libyang extensions plugins directory \"%s\" (%s).",pcVar4,pcVar1);
  }
  else {
    ly_load_plugins_dir((DIR *)pDVar2,pcVar4,1);
    closedir(pDVar2);
  }
  pcVar1 = getenv("LIBYANG_USER_TYPES_PLUGINS_DIR");
  pcVar4 = "/usr/local/lib/libyang/user_types";
  if (pcVar1 != (char *)0x0) {
    pcVar4 = pcVar1;
  }
  pDVar2 = opendir(pcVar4);
  if (pDVar2 == (DIR *)0x0) {
    piVar3 = __errno_location();
    pcVar1 = strerror(*piVar3);
    ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
           "Failed to open libyang user types plugins directory \"%s\" (%s).",pcVar4,pcVar1);
  }
  else {
    ly_load_plugins_dir((DIR *)pDVar2,pcVar4,0);
    closedir(pDVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&plugins_lock);
  return;
}

Assistant:

API void
ly_load_plugins(void)
{
    DIR* dir;
    const char *pluginsdir;

#ifdef STATIC
    /* lock the extension plugins list */
    pthread_mutex_lock(&plugins_lock);

    ext_plugins = static_load_lyext_plugins(&ext_plugins_count);
    type_plugins = static_load_lytype_plugins(&type_plugins_count);

    int u;
    for (u = 0; u < static_loaded_plugins_count; u++) {
        ly_add_loaded_plugin(strdup(static_loaded_plugins[u]));
    }

    /* unlock the global structures */
    pthread_mutex_unlock(&plugins_lock);
    return;
#endif /* STATIC */

    /* lock the extension plugins list */
    pthread_mutex_lock(&plugins_lock);

    /* increase references */
    ++plugin_refs;

    /* try to get the plugins directory from environment variable */
    pluginsdir = getenv("LIBYANG_EXTENSIONS_PLUGINS_DIR");
    if (!pluginsdir) {
        pluginsdir = LYEXT_PLUGINS_DIR;
    }

    dir = opendir(pluginsdir);
    if (!dir) {
        /* no directory (or no access to it), no extension plugins */
        LOGWRN(NULL, "Failed to open libyang extensions plugins directory \"%s\" (%s).", pluginsdir, strerror(errno));
    } else {
        ly_load_plugins_dir(dir, pluginsdir, 1);
        closedir(dir);
    }

    /* try to get the plugins directory from environment variable */
    pluginsdir = getenv("LIBYANG_USER_TYPES_PLUGINS_DIR");
    if (!pluginsdir) {
        pluginsdir = LY_USER_TYPES_PLUGINS_DIR;
    }

    dir = opendir(pluginsdir);
    if (!dir) {
        /* no directory (or no access to it), no extension plugins */
        LOGWRN(NULL, "Failed to open libyang user types plugins directory \"%s\" (%s).", pluginsdir, strerror(errno));
    } else {
        ly_load_plugins_dir(dir, pluginsdir, 0);
        closedir(dir);
    }

    /* unlock the global structures */
    pthread_mutex_unlock(&plugins_lock);
}